

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O0

double sat_solver3_memory(sat_solver3 *s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double local_20;
  double Mem;
  int i;
  sat_solver3 *s_local;
  
  local_20 = 672.0;
  for (Mem._4_4_ = 0; SBORROW4(Mem._4_4_,s->cap * 2) != Mem._4_4_ + s->cap * -2 < 0;
      Mem._4_4_ = Mem._4_4_ + 1) {
    lVar5 = (long)s->wlists[Mem._4_4_].cap << 2;
    auVar19._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar19._0_8_ = lVar5;
    auVar19._12_4_ = 0x45300000;
    local_20 = (auVar19._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0) + local_20;
  }
  lVar5 = (long)s->cap << 4;
  auVar24._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar24._0_8_ = lVar5;
  auVar24._12_4_ = 0x45300000;
  lVar6 = (long)s->cap << 2;
  auVar25._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar25._0_8_ = lVar6;
  auVar25._12_4_ = 0x45300000;
  iVar1 = s->cap;
  auVar26._8_4_ = iVar1 >> 0x1f;
  auVar26._0_8_ = (long)iVar1;
  auVar26._12_4_ = 0x45300000;
  iVar2 = s->cap;
  auVar27._8_4_ = iVar2 >> 0x1f;
  auVar27._0_8_ = (long)iVar2;
  auVar27._12_4_ = 0x45300000;
  iVar3 = s->cap;
  auVar28._8_4_ = iVar3 >> 0x1f;
  auVar28._0_8_ = (long)iVar3;
  auVar28._12_4_ = 0x45300000;
  iVar4 = s->cap;
  auVar29._8_4_ = iVar4 >> 0x1f;
  auVar29._0_8_ = (long)iVar4;
  auVar29._12_4_ = 0x45300000;
  lVar7 = (long)s->cap << 3;
  auVar20._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar20._0_8_ = lVar7;
  auVar20._12_4_ = 0x45300000;
  local_20 = (auVar20._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) +
             local_20 +
             (auVar24._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0) +
             (auVar25._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0) +
             (auVar26._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0) +
             (auVar27._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0) +
             (auVar28._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0) +
             (auVar29._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0);
  if (s->activity2 != (word *)0x0) {
    lVar5 = (long)s->cap << 3;
    auVar21._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar21._0_8_ = lVar5;
    auVar21._12_4_ = 0x45300000;
    local_20 = (auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0) + local_20;
  }
  if (s->factors != (double *)0x0) {
    lVar5 = (long)s->cap << 3;
    auVar22._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar22._0_8_ = lVar5;
    auVar22._12_4_ = 0x45300000;
    local_20 = (auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0) + local_20;
  }
  lVar5 = (long)s->cap << 2;
  auVar30._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar30._0_8_ = lVar5;
  auVar30._12_4_ = 0x45300000;
  lVar6 = (long)s->cap << 2;
  auVar31._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar31._0_8_ = lVar6;
  auVar31._12_4_ = 0x45300000;
  lVar7 = (long)s->cap << 2;
  auVar32._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar32._0_8_ = lVar7;
  auVar32._12_4_ = 0x45300000;
  lVar8 = (long)s->cap << 2;
  auVar33._8_4_ = (int)((ulong)lVar8 >> 0x20);
  auVar33._0_8_ = lVar8;
  auVar33._12_4_ = 0x45300000;
  lVar9 = (long)(s->order).cap << 2;
  auVar34._8_4_ = (int)((ulong)lVar9 >> 0x20);
  auVar34._0_8_ = lVar9;
  auVar34._12_4_ = 0x45300000;
  lVar10 = (long)(s->trail_lim).cap << 2;
  auVar35._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar35._0_8_ = lVar10;
  auVar35._12_4_ = 0x45300000;
  lVar11 = (long)(s->tagged).cap << 2;
  auVar36._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar36._0_8_ = lVar11;
  auVar36._12_4_ = 0x45300000;
  lVar12 = (long)(s->stack).cap << 2;
  auVar37._8_4_ = (int)((ulong)lVar12 >> 0x20);
  auVar37._0_8_ = lVar12;
  auVar37._12_4_ = 0x45300000;
  lVar13 = (long)(s->act_vars).cap << 2;
  auVar38._8_4_ = (int)((ulong)lVar13 >> 0x20);
  auVar38._0_8_ = lVar13;
  auVar38._12_4_ = 0x45300000;
  lVar14 = (long)(s->unit_lits).cap << 2;
  auVar39._8_4_ = (int)((ulong)lVar14 >> 0x20);
  auVar39._0_8_ = lVar14;
  auVar39._12_4_ = 0x45300000;
  lVar15 = (long)(s->act_clas).cap << 2;
  auVar40._8_4_ = (int)((ulong)lVar15 >> 0x20);
  auVar40._0_8_ = lVar15;
  auVar40._12_4_ = 0x45300000;
  lVar16 = (long)(s->temp_clause).cap << 2;
  auVar41._8_4_ = (int)((ulong)lVar16 >> 0x20);
  auVar41._0_8_ = lVar16;
  auVar41._12_4_ = 0x45300000;
  lVar17 = (long)(s->conf_final).cap << 2;
  auVar23._8_4_ = (int)((ulong)lVar17 >> 0x20);
  auVar23._0_8_ = lVar17;
  auVar23._12_4_ = 0x45300000;
  dVar18 = Sat_MemMemoryAll(&s->Mem);
  return dVar18 + (auVar23._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0) +
                  local_20 +
                  (auVar30._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0) +
                  (auVar31._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0) +
                  (auVar32._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0) +
                  (auVar33._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0) +
                  (auVar34._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0) +
                  (auVar35._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0) +
                  (auVar36._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0) +
                  (auVar37._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0) +
                  (auVar38._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0) +
                  (auVar39._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0) +
                  (auVar40._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0) +
                  (auVar41._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0);
}

Assistant:

double sat_solver3_memory( sat_solver3* s )
{
    int i;
    double Mem = sizeof(sat_solver3);
    for (i = 0; i < s->cap*2; i++)
        Mem += s->wlists[i].cap * sizeof(int);
    Mem += s->cap * sizeof(veci);     // ABC_FREE(s->wlists   );
    Mem += s->cap * sizeof(int);      // ABC_FREE(s->levels   );
    Mem += s->cap * sizeof(char);     // ABC_FREE(s->assigns  );
    Mem += s->cap * sizeof(char);     // ABC_FREE(s->polarity );
    Mem += s->cap * sizeof(char);     // ABC_FREE(s->tags     );
    Mem += s->cap * sizeof(char);     // ABC_FREE(s->loads    );
    Mem += s->cap * sizeof(word);     // ABC_FREE(s->activity );
    if ( s->activity2 )
    Mem += s->cap * sizeof(word);     // ABC_FREE(s->activity );
    if ( s->factors )
    Mem += s->cap * sizeof(double);   // ABC_FREE(s->factors  );
    Mem += s->cap * sizeof(int);      // ABC_FREE(s->orderpos );
    Mem += s->cap * sizeof(int);      // ABC_FREE(s->reasons  );
    Mem += s->cap * sizeof(lit);      // ABC_FREE(s->trail    );
    Mem += s->cap * sizeof(int);      // ABC_FREE(s->model    );

    Mem += s->order.cap * sizeof(int);
    Mem += s->trail_lim.cap * sizeof(int);
    Mem += s->tagged.cap * sizeof(int);
//    Mem += s->learned.cap * sizeof(int);
    Mem += s->stack.cap * sizeof(int);
    Mem += s->act_vars.cap * sizeof(int);
    Mem += s->unit_lits.cap * sizeof(int);
    Mem += s->act_clas.cap * sizeof(int);
    Mem += s->temp_clause.cap * sizeof(int);
    Mem += s->conf_final.cap * sizeof(int);
    Mem += Sat_MemMemoryAll( &s->Mem );
    return Mem;
}